

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer2.c
# Opt level: O0

ktx_error_code_e ktxTexture2_DeflateZstd(ktxTexture2 *This,ktx_uint32_t compressionLevel)

{
  uint uVar1;
  uint uVar2;
  ZSTD_ErrorCode ZVar3;
  void *__dest;
  ZSTD_CCtx *cctx_00;
  size_t sVar4;
  ZSTD_CCtx *__ptr;
  void *__dest_00;
  long in_RDI;
  ZSTD_ErrorCode error;
  size_t levelByteLengthCmp;
  int32_t level_1;
  int32_t level;
  ZSTD_CCtx *cctx;
  ktx_error_code_e result;
  ktx_uint8_t *pCmpDst;
  ktxLevelIndexEntry *nindex;
  ktxLevelIndexEntry *cindex;
  ktx_size_t levelOffset;
  ktx_size_t byteLengthCmp;
  ktx_size_t dstRemainingByteLength;
  ktx_uint8_t *cmpData;
  ktx_uint8_t *workBuf;
  ktx_uint32_t levelIndexByteLength;
  size_t in_stack_ffffffffffffff88;
  int iVar5;
  int iVar6;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  void *__src;
  ZSTD_CCtx *cctx_01;
  long local_40;
  size_t local_38;
  long local_30;
  ktx_error_code_e local_4;
  
  uVar1 = *(int *)(in_RDI + 0x34) * 0x18;
  local_30 = 0;
  local_38 = 0;
  local_40 = 0;
  __dest = (void *)(*(long *)(in_RDI + 0xa0) + 0x20);
  cctx_00 = ZSTD_createCCtx();
  if (cctx_00 == (ZSTD_CCtx *)0x0) {
    local_4 = KTX_OUT_OF_MEMORY;
  }
  else if (*(int *)(in_RDI + 0x88) == 0) {
    iVar6 = *(int *)(in_RDI + 0x34);
    while (iVar6 = iVar6 + -1, -1 < iVar6) {
      sVar4 = ZSTD_compressBound(*(size_t *)((long)__dest + (long)iVar6 * 0x18 + 8));
      local_30 = sVar4 + local_30;
    }
    __ptr = (ZSTD_CCtx *)malloc(local_30 + (ulong)uVar1);
    if (__ptr == (ZSTD_CCtx *)0x0) {
      local_4 = KTX_OUT_OF_MEMORY;
LAB_00541efe:
      ZSTD_freeCCtx(cctx_00);
      free(__ptr);
    }
    else {
      __src = (void *)((long)&__ptr->stage + (ulong)uVar1);
      iVar5 = *(int *)(in_RDI + 0x34);
      cctx_01 = __ptr;
      while (iVar5 = iVar5 + -1, -1 < iVar5) {
        in_stack_ffffffffffffff88 =
             ZSTD_compressCCtx(cctx_01,__src,
                               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),cctx_00
                               ,CONCAT44(iVar6,iVar5),(int)(in_stack_ffffffffffffff88 >> 0x20));
        uVar2 = ZSTD_isError(0x541d16);
        if (uVar2 != 0) {
          free(__ptr);
          ZVar3 = ZSTD_getErrorCode(0x541d2f);
          switch(ZVar3) {
          case ZSTD_error_parameter_outOfBound:
            local_4 = KTX_INVALID_VALUE;
            break;
          default:
            local_4 = KTX_INVALID_OPERATION;
            break;
          case ZSTD_error_memory_allocation:
            local_4 = KTX_OUT_OF_MEMORY;
            break;
          case ZSTD_error_workSpace_tooSmall:
            local_4 = KTX_OUT_OF_MEMORY;
            break;
          case ZSTD_error_dstSize_tooSmall:
            local_4 = KTX_OUT_OF_MEMORY;
          }
          goto LAB_00541efe;
        }
        *(long *)(&cctx_01->stage + (long)iVar5 * 6) = local_40;
        *(undefined8 *)(&(cctx_01->requestedParams).format + (long)iVar5 * 6) =
             *(undefined8 *)((long)__dest + (long)iVar5 * 0x18 + 8);
        *(size_t *)(&cctx_01->bmi2 + (long)iVar5 * 6) = in_stack_ffffffffffffff88;
        local_38 = in_stack_ffffffffffffff88 + local_38;
        local_40 = in_stack_ffffffffffffff88 + local_40;
      }
      ZSTD_freeCCtx(cctx_00);
      __dest_00 = malloc(local_38);
      if (__dest_00 == (void *)0x0) {
        free(__ptr);
        local_4 = KTX_OUT_OF_MEMORY;
      }
      else {
        memcpy(__dest_00,__src,local_38);
        memcpy(__dest,cctx_01,(ulong)uVar1);
        free(__ptr);
        free(*(void **)(in_RDI + 0x70));
        *(void **)(in_RDI + 0x70) = __dest_00;
        *(size_t *)(in_RDI + 0x68) = local_38;
        *(undefined4 *)(in_RDI + 0x88) = 2;
        *(undefined4 *)(*(long *)(in_RDI + 0xa0) + 8) = 1;
        local_4 = KTX_SUCCESS;
      }
    }
  }
  else {
    local_4 = KTX_INVALID_OPERATION;
  }
  return local_4;
}

Assistant:

KTX_error_code
ktxTexture2_DeflateZstd(ktxTexture2* This, ktx_uint32_t compressionLevel)
{
    ktx_uint32_t levelIndexByteLength =
                            This->numLevels * sizeof(ktxLevelIndexEntry);
    ktx_uint8_t* workBuf;
    ktx_uint8_t* cmpData;
    ktx_size_t dstRemainingByteLength = 0;
    ktx_size_t byteLengthCmp = 0;
    ktx_size_t levelOffset = 0;
    ktxLevelIndexEntry* cindex = This->_private->_levelIndex;
    ktxLevelIndexEntry* nindex;
    ktx_uint8_t* pCmpDst;
    ktx_error_code_e result;

    ZSTD_CCtx* cctx = ZSTD_createCCtx();
    if (cctx == NULL)
        return KTX_OUT_OF_MEMORY;

    if (This->supercompressionScheme != KTX_SS_NONE)
        return KTX_INVALID_OPERATION;

    // On rare occasions the deflated data can be a few bytes larger than
    // the source data. Calculating the dst buffer size using
    // ZSTD_compressBound provides a suitable size plus compression is said
    // to run faster when the dst buffer is >= compressBound.
    for (int32_t level = This->numLevels - 1; level >= 0; level--) {
        dstRemainingByteLength += ZSTD_compressBound(cindex[level].byteLength);
    }

    workBuf = malloc(dstRemainingByteLength + levelIndexByteLength);
    if (workBuf == NULL) {
        result = KTX_OUT_OF_MEMORY;
        goto cleanup;
    }
    nindex = (ktxLevelIndexEntry*)workBuf;
    pCmpDst = &workBuf[levelIndexByteLength];

    for (int32_t level = This->numLevels - 1; level >= 0; level--) {
        size_t levelByteLengthCmp =
            ZSTD_compressCCtx(cctx, pCmpDst + levelOffset,
                              dstRemainingByteLength,
                              &This->pData[cindex[level].byteOffset],
                              cindex[level].byteLength,
                              compressionLevel);
        if (ZSTD_isError(levelByteLengthCmp)) {
            free(workBuf);
            ZSTD_ErrorCode error = ZSTD_getErrorCode(levelByteLengthCmp);
            switch(error) {
              case ZSTD_error_parameter_outOfBound:
                result = KTX_INVALID_VALUE;
                goto cleanup;
              case ZSTD_error_dstSize_tooSmall:
#ifdef DEBUG
                assert(false && "Deflate dstSize too small.");
#else
                result = KTX_OUT_OF_MEMORY;
                goto cleanup;
#endif
              case ZSTD_error_workSpace_tooSmall:
#ifdef DEBUG
                assert(false && "Deflate workspace too small.");
#else
                result = KTX_OUT_OF_MEMORY;
                goto cleanup;
#endif
              case ZSTD_error_memory_allocation:
                result = KTX_OUT_OF_MEMORY;
                goto cleanup;
              default:
                // The remaining errors look like they should only
                // occur during decompression but just in case.
#ifdef DEBUG
                assert(true);
#else
                result = KTX_INVALID_OPERATION;
                goto cleanup;
#endif
            }
        }
        nindex[level].byteOffset = levelOffset;
        nindex[level].uncompressedByteLength = cindex[level].byteLength;
        nindex[level].byteLength = levelByteLengthCmp;
        byteLengthCmp += levelByteLengthCmp;
        levelOffset += levelByteLengthCmp;
        dstRemainingByteLength -= levelByteLengthCmp;
    }
    ZSTD_freeCCtx(cctx);

    // Move the compressed data into a correctly sized buffer.
    cmpData = malloc(byteLengthCmp);
    if (cmpData == NULL) {
        free(workBuf);
        return KTX_OUT_OF_MEMORY;
    }
    // Now modify the texture.
    memcpy(cmpData, pCmpDst, byteLengthCmp); // Copy data to sized buffer.
    memcpy(cindex, nindex, levelIndexByteLength); // Update level index
    free(workBuf);
    free(This->pData);
    This->pData = cmpData;
    This->dataSize = byteLengthCmp;
    This->supercompressionScheme = KTX_SS_ZSTD;
    This->_private->_requiredLevelAlignment = 1;

    return KTX_SUCCESS;

cleanup:
    ZSTD_freeCCtx(cctx);
    free(workBuf);
    return result;
}